

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O2

void __thiscall OpenMD::DirectionalAtom::rotateBy(DirectionalAtom *this,RotMat3x3d *m)

{
  RotMat3x3d local_b0;
  SquareMatrix3<double> local_68;
  
  StuntDouble::getA(&local_b0,(StuntDouble *)this);
  operator*(&local_68,m,&local_b0);
  (*(this->super_Atom).super_StuntDouble._vptr_StuntDouble[3])(this,&local_68);
  return;
}

Assistant:

void DirectionalAtom::rotateBy(const RotMat3x3d& m) { setA(m * getA()); }